

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O0

int X509_VERIFY_PARAM_add0_policy(X509_VERIFY_PARAM *param,ASN1_OBJECT *policy)

{
  long lVar1;
  long lVar2;
  stack_st_ASN1_OBJECT *psVar3;
  size_t sVar4;
  ASN1_OBJECT *policy_local;
  X509_VERIFY_PARAM *param_local;
  
  lVar1._0_4_ = param->purpose;
  lVar1._4_4_ = param->trust;
  if (lVar1 == 0) {
    psVar3 = sk_ASN1_OBJECT_new_null();
    *(stack_st_ASN1_OBJECT **)&param->purpose = psVar3;
    lVar2._0_4_ = param->purpose;
    lVar2._4_4_ = param->trust;
    if (lVar2 == 0) {
      return 0;
    }
  }
  sVar4 = sk_ASN1_OBJECT_push(*(stack_st_ASN1_OBJECT **)&param->purpose,(ASN1_OBJECT *)policy);
  param_local._4_4_ = (uint)(sVar4 != 0);
  return param_local._4_4_;
}

Assistant:

int X509_VERIFY_PARAM_add0_policy(X509_VERIFY_PARAM *param,
                                  ASN1_OBJECT *policy) {
  if (!param->policies) {
    param->policies = sk_ASN1_OBJECT_new_null();
    if (!param->policies) {
      return 0;
    }
  }
  if (!sk_ASN1_OBJECT_push(param->policies, policy)) {
    return 0;
  }
  return 1;
}